

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AddError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *error)

{
  ErrorCollector *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  pEVar1 = this->error_collector_;
  if (pEVar1 == (ErrorCollector *)0x0) {
    if (this->had_errors_ == false) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0xe03);
      pLVar2 = internal::LogMessage::operator<<(&local_58,"Invalid proto descriptor for file \"");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,&this->filename_);
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"\":");
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
    }
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0xe06);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"  ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,element_name);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,": ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,error);
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  else {
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,&this->filename_,element_name,descriptor,(ulong)location,error);
  }
  this->had_errors_ = true;
  return;
}

Assistant:

void DescriptorBuilder::AddError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& error) {
  if (error_collector_ == nullptr) {
    if (!had_errors_) {
      GOOGLE_LOG(ERROR) << "Invalid proto descriptor for file \"" << filename_
                 << "\":";
    }
    GOOGLE_LOG(ERROR) << "  " << element_name << ": " << error;
  } else {
    error_collector_->AddError(filename_, element_name, &descriptor, location,
                               error);
  }
  had_errors_ = true;
}